

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O0

bool __thiscall BamTools::BamAlignment::GetTagType(BamAlignment *this,string *tag,char *type)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *in_RDX;
  uint *in_RDI;
  string message;
  uint numBytesParsed;
  uint tagDataLength;
  char *pTagData;
  undefined8 in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint *in_stack_ffffffffffffff50;
  char **in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  BamAlignment *in_stack_ffffffffffffff68;
  allocator<char> local_71;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  string local_50 [32];
  undefined4 local_30;
  undefined4 local_2c;
  long local_28;
  char *local_20;
  byte local_1;
  
  if ((in_RDI[0x4c] & 1) == 0) {
    local_20 = in_RDX;
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_28 = std::__cxx11::string::data();
      local_2c = std::__cxx11::string::size();
      local_30 = 0;
      bVar1 = FindTag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                      in_stack_ffffffffffffff50,in_RDI);
      if (bVar1) {
        *local_20 = *(char *)(local_28 + -1);
        iVar2 = (int)*local_20;
        if (((((iVar2 - 0x41U < 3) || (iVar2 - 0x48U < 2)) || (iVar2 == 0x53)) ||
            ((iVar2 == 0x5a || (iVar2 == 99)))) ||
           ((iVar2 == 0x66 || ((iVar2 == 0x69 || (iVar2 == 0x73)))))) {
          local_1 = 1;
        }
        else {
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_71;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&stack0xffffffffffffff90,"invalid tag type: ",(allocator *)__lhs);
          std::operator+(__lhs,(char)((ulong)in_stack_ffffffffffffff30 >> 0x38));
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
          std::allocator<char>::~allocator(&local_71);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&stack0xffffffffffffff58,"BamAlignment::GetTagType",
                     (allocator *)&stack0xffffffffffffff57);
          SetErrorString((BamAlignment *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffff90);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
          local_1 = 0;
          std::__cxx11::string::~string(local_50);
        }
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamAlignment::GetTagType(const std::string& tag, char& type) const
{

    // skip if alignment is core-only
    if (SupportData.HasCoreOnly) {
        // TODO: set error string?
        return false;
    }

    // skip if no tags present
    if (TagData.empty()) {
        // TODO: set error string?
        return false;
    }

    // localize the tag data
    char* pTagData = (char*)TagData.data();
    const unsigned int tagDataLength = TagData.size();
    unsigned int numBytesParsed = 0;

    // if tag not found, return failure
    if (!FindTag(tag, pTagData, tagDataLength, numBytesParsed)) {
        // TODO: set error string?
        return false;
    }

    // otherwise, retrieve & validate tag type code
    type = *(pTagData - 1);
    switch (type) {
        case (Constants::BAM_TAG_TYPE_ASCII):
        case (Constants::BAM_TAG_TYPE_INT8):
        case (Constants::BAM_TAG_TYPE_UINT8):
        case (Constants::BAM_TAG_TYPE_INT16):
        case (Constants::BAM_TAG_TYPE_UINT16):
        case (Constants::BAM_TAG_TYPE_INT32):
        case (Constants::BAM_TAG_TYPE_UINT32):
        case (Constants::BAM_TAG_TYPE_FLOAT):
        case (Constants::BAM_TAG_TYPE_STRING):
        case (Constants::BAM_TAG_TYPE_HEX):
        case (Constants::BAM_TAG_TYPE_ARRAY):
            return true;

        // unknown tag type
        default:
            const std::string message = std::string("invalid tag type: ") + type;
            SetErrorString("BamAlignment::GetTagType", message);
            return false;
    }
}